

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

bool DoRadiusGive(AActor *self,AActor *thing,PClassActor *item,int amount,double distance,int flags,
                 PClassActor *filter,FName species,double mindist)

{
  byte *pbVar1;
  player_t *ppVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  AActor *pAVar6;
  AActor *pAVar7;
  AActor *pAVar8;
  AInventory *this;
  bool bVar9;
  double dVar10;
  undefined4 in_stack_0000000c;
  FName local_4c;
  DVector3 diff;
  
  if (thing == self) {
    uVar3 = flags & 1;
  }
  else {
    if (((thing->flags).Value & 0x10000) == 0) {
      if ((((((uint)flags >> 0xd & 1) == 0) ||
           (bVar4 = DObject::IsKindOf((DObject *)thing,AInventory::RegistrationInfo.MyClass), !bVar4
           )) && (((flags & 0x20U) == 0 || (((thing->flags).Value & 0x100000) == 0)))) &&
         ((((uint)flags >> 0xe & 1) == 0 || (((thing->flags6).Value & 0x40000) == 0)))) {
        if ((flags & 0x1eU) == 0) {
          return false;
        }
        if (thing->health < 1) {
          return false;
        }
        ppVar2 = thing->player;
        if (ppVar2 == (player_t *)0x0) {
          if (((flags & 4U) == 0) || (((thing->flags3).Value & 0x2000) == 0)) {
            if ((flags & 8U) == 0) {
              return false;
            }
            if (((thing->flags3).Value & 0x2000) != 0) {
              return false;
            }
            if ((((thing->flags).Value & 4) == 0) && (((thing->flags6).Value & 0x1000) == 0)) {
              return false;
            }
          }
        }
        else if (((flags & 2U) == 0) || (ppVar2->mo != (APlayerPawn *)thing)) {
          if ((flags & 0x10U) == 0) {
            return false;
          }
          if (ppVar2->mo == (APlayerPawn *)thing) {
            return false;
          }
        }
      }
      goto LAB_003ec09b;
    }
    uVar3 = (uint)flags >> 0xb & 1;
  }
  if (uVar3 == 0) {
    return false;
  }
LAB_003ec09b:
  bVar4 = DoCheckClass(thing,filter,SUB41((flags & 0xffffU) >> 0xf,0));
  local_4c.Index = *(int *)CONCAT44(in_stack_0000000c,species.Index);
  bVar5 = DoCheckSpecies(thing,&local_4c,(bool)((byte)((uint)flags >> 0x10) & 1));
  if (((uint)flags >> 0x11 & 1) == 0) {
    if (thing != self && (!bVar4 || !bVar5)) {
      return false;
    }
  }
  else if ((!bVar4 && !bVar5) && thing != self) {
    return false;
  }
  if ((flags & 0x1c0U) != 0 && thing != self) {
    pAVar6 = GC::ReadBarrier<AActor>((AActor **)&self->target);
    bVar5 = (flags & 0x40U) != 0;
    pAVar7 = GC::ReadBarrier<AActor>((AActor **)&self->master);
    bVar4 = ((uint)flags >> 8 & 1) != 0;
    pAVar8 = GC::ReadBarrier<AActor>((AActor **)&self->tracer);
    bVar9 = (char)flags < '\0';
    if (((uint)flags >> 0xc & 1) == 0) {
      if (bVar5 && pAVar6 == thing || (bVar4 && pAVar7 == thing || bVar9 && pAVar8 == thing)) {
        return false;
      }
    }
    else if ((bVar5 && pAVar6 == thing) &&
             ((bVar4 && pAVar7 == thing) && (bVar9 && pAVar8 == thing))) {
      return false;
    }
  }
  AActor::Vec3To(&diff,self,thing);
  diff.Z = thing->Height * 0.5 + diff.Z;
  if (((uint)flags >> 9 & 1) == 0) {
    dVar10 = diff.Z * diff.Z + diff.Y * diff.Y + diff.X * diff.X;
    if (distance * distance < dVar10) {
      return false;
    }
    if (((mindist != 0.0) || (NAN(mindist))) && (dVar10 < mindist * mindist)) {
      return false;
    }
  }
  else {
    if (distance < ABS(diff.X)) {
      return false;
    }
    if (distance < ABS(diff.Y)) {
      return false;
    }
    if (distance < ABS(diff.Z)) {
      return false;
    }
    if ((((mindist != 0.0) || (NAN(mindist))) && (ABS(diff.X) < mindist)) &&
       ((ABS(diff.Y) < mindist && (ABS(diff.Z) < mindist)))) {
      return false;
    }
  }
  if ((((uint)flags >> 10 & 1) != 0) || (bVar4 = P_CheckSight(thing,self,9), bVar4)) {
    this = (AInventory *)Spawn(item);
    bVar4 = DObject::IsKindOf((DObject *)this,AHealth::RegistrationInfo.MyClass);
    if (bVar4) {
      amount = amount * this->Amount;
    }
    this->Amount = amount;
    pbVar1 = (byte *)((long)&(this->super_AActor).flags.Value + 2);
    *pbVar1 = *pbVar1 | 2;
    AActor::ClearCounters((AActor *)this);
    bVar4 = AInventory::CallTryPickup(this,thing,(AActor **)0x0);
    if (bVar4) {
      return true;
    }
    (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(this);
  }
  return false;
}

Assistant:

static bool DoRadiusGive(AActor *self, AActor *thing, PClassActor *item, int amount, double distance, int flags, PClassActor *filter, FName species, double mindist)
{
	
	bool doPass = false;
	// Always allow self to give, no matter what other flags are specified. Otherwise, not at all.
	if (thing == self)
	{
		if (!(flags & RGF_GIVESELF))
			return false;
		doPass = true;
	}
	else if (thing->flags & MF_MISSILE)
	{
		if (!(flags & RGF_MISSILES))
			return false;
		doPass = true;
	}
	else if (((flags & RGF_ITEMS) && thing->IsKindOf(RUNTIME_CLASS(AInventory))) ||
			((flags & RGF_CORPSES) && thing->flags & MF_CORPSE) ||
			((flags & RGF_KILLED) && thing->flags6 & MF6_KILLED))
	{
		doPass = true;
	}
	else if ((flags & (RGF_MONSTERS | RGF_OBJECTS | RGF_PLAYERS | RGF_VOODOO)))
	{
		// Make sure it's alive as we're not looking for corpses or killed here.
		if (!doPass && thing->health > 0)
		{
			if (thing->player != nullptr)
			{
				if (((flags & RGF_PLAYERS) && (thing->player->mo == thing)) ||
					((flags & RGF_VOODOO) && (thing->player->mo != thing)))
				{
					doPass = true;
				}
			}
			else
			{
				if (((flags & RGF_MONSTERS) && (thing->flags3 & MF3_ISMONSTER)) ||
					((flags & RGF_OBJECTS) && (!(thing->flags3 & MF3_ISMONSTER)) &&
					(thing->flags & MF_SHOOTABLE || thing->flags6 & MF6_VULNERABLE)))
				{
					doPass = true;
				}
			}
		}
	}

	// Nothing matched up so don't bother with the rest.
	if (!doPass)
		return false;

	//[MC] Check for a filter, species, and the related exfilter/expecies/either flag(s).
	bool filterpass = DoCheckClass(thing, filter, !!(flags & RGF_EXFILTER)),
		speciespass = DoCheckSpecies(thing, species, !!(flags & RGF_EXSPECIES));

	if ((flags & RGF_EITHER) ? (!(filterpass || speciespass)) : (!(filterpass && speciespass)))
	{
		if (thing != self)      //Don't let filter and species obstruct RGF_GIVESELF.
			return false;
	}

	if ((thing != self) && (flags & (RGF_NOTARGET | RGF_NOMASTER | RGF_NOTRACER)))
	{
		//Check for target, master, and tracer flagging.
		bool targetPass = true;
		bool masterPass = true;
		bool tracerPass = true;
		bool ptrPass = false;

		if ((thing == self->target) && (flags & RGF_NOTARGET))
			targetPass = false;
		if ((thing == self->master) && (flags & RGF_NOMASTER))
			masterPass = false;
		if ((thing == self->tracer) && (flags & RGF_NOTRACER))
			tracerPass = false;

		ptrPass = (flags & RGF_INCLUSIVE) ? (targetPass || masterPass || tracerPass) : (targetPass && masterPass && tracerPass);

		//We should not care about what the actor is here. It's safe to abort this actor.
		if (!ptrPass)
			return false;
	}

	if (doPass)
	{
		DVector3 diff = self->Vec3To(thing);
		diff.Z += thing->Height *0.5;
		if (flags & RGF_CUBE)
		{ // check if inside a cube
			double dx = fabs(diff.X);
			double dy = fabs(diff.Y);
			double dz = fabs(diff.Z);
			if ((dx > distance || dy > distance || dz > distance) || (mindist && (dx < mindist && dy < mindist && dz < mindist)))
			{
				return false;
			}
		}
		else
		{ // check if inside a sphere
			double lengthsquared = diff.LengthSquared();
			if (lengthsquared > distance*distance || (mindist && (lengthsquared < mindist*mindist)))
			{
				return false;
			}
		}

		if ((flags & RGF_NOSIGHT) || P_CheckSight(thing, self, SF_IGNOREVISIBILITY | SF_IGNOREWATERBOUNDARY))
		{ // OK to give; target is in direct path, or the monster doesn't care about it being in line of sight.
			AInventory *gift = static_cast<AInventory *>(Spawn(item));
			if (gift->IsKindOf(RUNTIME_CLASS(AHealth)))
			{
				gift->Amount *= amount;
			}
			else
			{
				gift->Amount = amount;
			}
			gift->flags |= MF_DROPPED;
			gift->ClearCounters();
			if (!gift->CallTryPickup(thing))
			{
				gift->Destroy();
				return false;
			}
			else
			{
				return true;
			}
		}
	}
	return false;
}